

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  int iVar2;
  timespec start;
  timespec end;
  timespec local_38;
  timespec local_28;
  
  clock_gettime(1,&local_38);
  iVar2 = 10000000;
  do {
    _global_ = simple_return(_global_);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  clock_gettime(1,&local_28);
  printf("%s, simple:\n\t %lld\n","main",
         ((local_28.tv_sec - local_38.tv_sec) * 1000000000 + local_28.tv_nsec) - local_38.tv_nsec);
  clock_gettime(1,&local_38);
  iVar2 = 10000000;
  do {
    _global_ = memcpy_return(_global_);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  clock_gettime(1,&local_28);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((local_28.tv_sec - local_38.tv_sec) * 1000000000 + local_28.tv_nsec) - local_38.tv_nsec);
  uVar1 = float_to_int1(1.23);
  printf("%s, %d\n","main",(ulong)uVar1);
  uVar1 = float_to_int2(1.23);
  printf("%s, %d\n","main",(ulong)uVar1);
  uVar1 = float_to_int3(1.23);
  printf("%s, %d\n","main",(ulong)uVar1);
  clock_gettime(1,&local_38);
  iVar2 = 10000000;
  do {
    _global_ = float_to_int3(1.23);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  clock_gettime(1,&local_28);
  printf("%s, memcpy2:\n\t %lld\n","main",
         ((local_28.tv_sec - local_38.tv_sec) * 1000000000 + local_28.tv_nsec) - local_38.tv_nsec);
  clock_gettime(1,&local_38);
  iVar2 = 10000000;
  do {
    _global_ = float_to_int1(1.23);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  clock_gettime(1,&local_28);
  printf("%s, memcpy:\n\t %lld\n","main",
         ((local_28.tv_sec - local_38.tv_sec) * 1000000000 + local_28.tv_nsec) - local_38.tv_nsec);
  clock_gettime(1,&local_38);
  iVar2 = 10000000;
  do {
    _global_ = float_to_int2(1.23);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  clock_gettime(1,&local_28);
  printf("%s, cast:\n\t %lld\n","main",
         ((local_28.tv_sec - local_38.tv_sec) * 1000000000 + local_28.tv_nsec) - local_38.tv_nsec);
  return 0;
}

Assistant:

int
main()
{
    unsigned int i;
    struct timespec start, end;
    long long t;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        _global_ = simple_return(_global_);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, simple:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        _global_ = memcpy_return(_global_);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);

    float f = 1.23;

    printf("%s, %d\n", __func__, float_to_int1(f));
    printf("%s, %d\n", __func__, float_to_int2(f));
    printf("%s, %d\n", __func__, float_to_int3(f));

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        _global_ = float_to_int3(f);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy2:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        _global_ = float_to_int1(f);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, memcpy:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        _global_ = float_to_int2(f);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, cast:\n\t %lld\n", __func__, t);

    return 0;
}